

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments
          (sysbvm_context_t *context,sysbvm_tuple_t function,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  uint uVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  size_t sVar4;
  sysbvm_tuple_t sVar5;
  
  if (((((applicationFlags & 3) == 0) && ((function & 0xf) == 0 && function != 0)) &&
      (uVar2 = *(ulong *)function, (uVar2 & 0xf) == 0 && uVar2 != 0)) &&
     ((*(byte *)(uVar2 + 8) & 0x80) == 0)) {
    uVar2 = *(ulong *)(uVar2 + 0x70);
    if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
      uVar1 = (uint)((long)uVar2 >> 4);
    }
    else {
      uVar1 = (uint)*(undefined8 *)(uVar2 + 0x10);
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      uVar2 = *(ulong *)(function + 0x28);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        uVar2 = (long)uVar2 >> 4;
      }
      else {
        uVar2 = *(ulong *)(uVar2 + 0x10);
      }
      if ((uVar2 & 2) != 0) {
        sVar4 = sysbvm_function_getArgumentCount(context,function);
        if (sVar4 == 0) {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecode.c:102: assertion failure: expectedArgumentCount > 0"
                    );
        }
        uVar2 = sVar4 - 1;
        if (argumentCount < uVar2) {
          sysbvm_error("Missing required arguments.");
        }
        sVar3 = sysbvm_array_create(context,argumentCount - uVar2);
        for (sVar5 = 0; argumentCount - uVar2 != sVar5; sVar5 = sVar5 + 1) {
          *(sysbvm_tuple_t *)(sVar3 + 0x10 + sVar5 * 8) = (arguments + uVar2)[sVar5];
        }
        arguments[uVar2] = sVar3;
        argumentCount = sVar4;
      }
    }
  }
  sVar3 = sysbvm_function_apply(context,function,argumentCount,arguments,applicationFlags);
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments(sysbvm_context_t *context, sysbvm_tuple_t function, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    if((applicationFlags & (SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED)) == 0 &&
        sysbvm_function_isVariadic(context, function))
    {
        size_t expectedArgumentCount = sysbvm_function_getArgumentCount(context, function);
        SYSBVM_ASSERT(expectedArgumentCount > 0);

        // Move the variadic arguments into a variadic vector.
        {
            size_t directArgumentCount = expectedArgumentCount - 1;
            if(argumentCount < directArgumentCount)
                sysbvm_error("Missing required arguments.");

            size_t variadicArgumentCount = argumentCount - directArgumentCount;
            sysbvm_tuple_t variadicVector = sysbvm_array_create(context, variadicArgumentCount);
            sysbvm_tuple_t *variadicVectorElements = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(variadicVector)->pointers;
            for(size_t i = 0; i < variadicArgumentCount; ++i)
                variadicVectorElements[i] = arguments[directArgumentCount + i];
            arguments[directArgumentCount] = variadicVector;
        }

        return sysbvm_function_apply(context, function, expectedArgumentCount, arguments, applicationFlags);

    }
    return sysbvm_function_apply(context, function, argumentCount, arguments, applicationFlags);
}